

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O2

void __thiscall ObjLoader::parseFile(ObjLoader *this,string *filename)

{
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *this_00;
  int iVar1;
  int iVar2;
  pointer paVar3;
  pointer pvVar4;
  pointer paVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  pointer paVar9;
  int iVar10;
  ulong uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *psVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  vec<3,_float,_(glm::qualifier)0> vVar16;
  long local_7e0;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3 local_7c0;
  vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
  *local_7b0;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  SimpleMaterial material;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3 local_6a8;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3 local_698;
  string err;
  attrib_t attrib;
  string local_600;
  string local_5e0;
  string local_5c0;
  value_type local_5a0;
  
  attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  err.field_2._M_local_buf[0] = '\0';
  bVar6 = tinyobj::LoadObj(&attrib,&shapes,&materials,&err,(filename->_M_dataplus)._M_p,
                           (this->m_rootDir)._M_dataplus._M_p,true);
  if (err._M_string_length != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,(string *)&err);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  if (bVar6) {
    local_5a0.name._M_dataplus._M_p = (pointer)&local_5a0.name.field_2;
    local_5a0.name._M_string_length = 0;
    local_5a0.name.field_2._M_local_buf[0] = '\0';
    local_5a0.ambient_texname._M_dataplus._M_p = (pointer)&local_5a0.ambient_texname.field_2;
    local_5a0.ambient_texname._M_string_length = 0;
    local_5a0.ambient_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.diffuse_texname._M_dataplus._M_p = (pointer)&local_5a0.diffuse_texname.field_2;
    local_5a0.diffuse_texname._M_string_length = 0;
    local_5a0.diffuse_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.specular_texname._M_dataplus._M_p = (pointer)&local_5a0.specular_texname.field_2;
    local_5a0.specular_texname._M_string_length = 0;
    local_5a0.specular_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.specular_highlight_texname._M_dataplus._M_p =
         (pointer)&local_5a0.specular_highlight_texname.field_2;
    local_5a0.specular_highlight_texname._M_string_length = 0;
    local_5a0.specular_highlight_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.bump_texname._M_dataplus._M_p = (pointer)&local_5a0.bump_texname.field_2;
    local_5a0.bump_texname._M_string_length = 0;
    local_5a0.bump_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.displacement_texname._M_dataplus._M_p =
         (pointer)&local_5a0.displacement_texname.field_2;
    local_5a0.displacement_texname._M_string_length = 0;
    local_5a0.displacement_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.alpha_texname._M_dataplus._M_p = (pointer)&local_5a0.alpha_texname.field_2;
    local_5a0.alpha_texname._M_string_length = 0;
    local_5a0.alpha_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.reflection_texname._M_dataplus._M_p = (pointer)&local_5a0.reflection_texname.field_2;
    local_5a0.reflection_texname._M_string_length = 0;
    local_5a0.reflection_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.roughness_texname._M_dataplus._M_p = (pointer)&local_5a0.roughness_texname.field_2;
    local_5a0.roughness_texname._M_string_length = 0;
    local_5a0.roughness_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.metallic_texname._M_dataplus._M_p = (pointer)&local_5a0.metallic_texname.field_2;
    local_5a0.metallic_texname._M_string_length = 0;
    local_5a0.metallic_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.sheen_texname._M_dataplus._M_p = (pointer)&local_5a0.sheen_texname.field_2;
    local_5a0.sheen_texname._M_string_length = 0;
    local_5a0.sheen_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.emissive_texname._M_dataplus._M_p = (pointer)&local_5a0.emissive_texname.field_2;
    local_5a0.emissive_texname._M_string_length = 0;
    local_5a0.emissive_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.normal_texname._M_dataplus._M_p = (pointer)&local_5a0.normal_texname.field_2;
    local_5a0.normal_texname._M_string_length = 0;
    local_5a0.normal_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header;
    local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_5a0.ambient[0] = 0.1;
    local_5a0.ambient[1] = 0.1;
    local_5a0.ambient[2] = 0.1;
    local_5a0.diffuse[0] = 0.3;
    local_5a0.specular[2] = 0.2;
    local_5a0.diffuse[1] = 0.3;
    local_5a0.diffuse[2] = 0.3;
    local_5a0.specular[0] = 0.2;
    local_5a0.specular[1] = 0.2;
    local_5a0.shininess = 1.0;
    local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&local_5a0.name,"default_material");
    std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::push_back
              (&materials,&local_5a0);
    local_7e0 = 0;
    for (uVar13 = 0;
        paVar5 = materials.
                 super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar13 < (ulong)(((long)materials.
                                super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)materials.
                               super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x570);
        uVar13 = uVar13 + 1) {
      material.name._M_dataplus._M_p = (pointer)&material.name.field_2;
      material.name._M_string_length = 0;
      material.name.field_2._M_local_buf[0] = '\0';
      material.diffuseTexName._M_dataplus._M_p = (pointer)&material.diffuseTexName.field_2;
      material.diffuseTexName._M_string_length = 0;
      material.diffuseTexName.field_2._M_local_buf[0] = '\0';
      material.normalTexName._M_dataplus._M_p = (pointer)&material.normalTexName.field_2;
      material.normalTexName._M_string_length = 0;
      material.normalTexName.field_2._M_local_buf[0] = '\0';
      material.specularTexName._M_dataplus._M_p = (pointer)&material.specularTexName.field_2;
      material.specularTexName._M_string_length = 0;
      material.specularTexName.field_2._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&material.name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)(materials.
                         super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                         ._M_impl.super__Vector_impl_data._M_start)->ambient + local_7e0 + -0x20));
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)paVar5->emission + local_7e0 + 0x40);
      material.ambient.field_0.field_0.z = *(float *)((long)paVar5->ambient + local_7e0 + 8);
      material.ambient.field_0._0_8_ = *(undefined8 *)((long)paVar5->ambient + local_7e0);
      material.diffuse.field_0.field_0.z = *(float *)((long)paVar5->diffuse + local_7e0 + 8);
      material.diffuse.field_0._0_8_ = *(undefined8 *)((long)paVar5->diffuse + local_7e0);
      material.specular.field_0.field_0.z = *(float *)((long)paVar5->specular + local_7e0 + 8);
      material.specular.field_0._0_8_ = *(undefined8 *)((long)paVar5->specular + local_7e0);
      material.shininess = *(float *)((long)paVar5->emission + local_7e0 + 0xc);
      bVar6 = std::operator==(__lhs,"");
      psVar12 = __lhs;
      if (bVar6) {
        psVar12 = &defaultDiffuseName_abi_cxx11_;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&material.diffuseTexName,psVar12);
      __lhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)(paVar5->roughness_texopt).origin_offset + local_7e0 + -0x30);
      bVar6 = std::operator==(__lhs_00,"");
      psVar12 = __lhs_00;
      if (bVar6) {
        psVar12 = &defaultNormalName_abi_cxx11_;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&material.normalTexName,psVar12);
      bVar6 = std::operator==(__lhs_00,"");
      __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)paVar5->emission + local_7e0 + 0x60);
      psVar12 = __str;
      if (bVar6) {
        psVar12 = &defaultDiffuseName_abi_cxx11_;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&material.specularTexName,psVar12);
      std::__cxx11::string::string((string *)&local_5c0,__lhs);
      loadImage(this,&local_5c0);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::__cxx11::string::string((string *)&local_5e0,__lhs_00);
      loadImage(this,&local_5e0);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::string((string *)&local_600,__str);
      loadImage(this,&local_600);
      std::__cxx11::string::~string((string *)&local_600);
      std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>::push_back
                (&this->m_materials,&material);
      SimpleMaterial::~SimpleMaterial(&material);
      local_7e0 = local_7e0 + 0x570;
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::resize(&this->m_ibos,
             ((long)(this->m_materials).
                    super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->m_materials).
                   super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0xa8);
    this_00 = &this->m_vertexNormals;
    local_7b0 = (vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                 *)&this->m_vertexUVs;
    paVar9 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar13 = 0;
        uVar13 < (ulong)((long)shapes.
                               super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)paVar9 >> 7);
        uVar13 = uVar13 + 1) {
      local_7e0 = 0;
      for (uVar11 = 0;
          uVar11 < (ulong)((long)paVar9[uVar13].mesh.num_face_vertices.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)paVar9[uVar13].mesh.num_face_vertices.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start); uVar11 = uVar11 + 1) {
        iVar1 = paVar9[uVar13].mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar11];
        iVar2 = (int)(((long)materials.
                             super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)materials.
                            super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x570);
        iVar10 = iVar2 + -1;
        iVar7 = iVar10;
        if (iVar1 < iVar2) {
          iVar7 = iVar1;
        }
        if (iVar1 < 0) {
          iVar7 = iVar10;
        }
        for (lVar15 = 8; lVar15 != 0x2c; lVar15 = lVar15 + 0xc) {
          paVar3 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar13].mesh.indices.
                   super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar1 = *(int *)((long)paVar3 + lVar15 + -8 + local_7e0);
          lVar14 = (long)*(int *)((long)paVar3 + lVar15 + -4 + local_7e0);
          iVar2 = *(int *)((long)&paVar3->vertex_index + lVar15 + local_7e0);
          material.name._M_dataplus._M_p =
               *(pointer *)
                (attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + (long)iVar1 * 3);
          material.name._M_string_length =
               CONCAT44(material.name._M_string_length._4_4_,
                        attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)(iVar1 * 3) + 2]);
          std::
          vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
          ::emplace_back<glm::vec<3,float,(glm::qualifier)0>>
                    ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                      *)&this->m_vertexPositions,(vec<3,_float,_(glm::qualifier)0> *)&material);
          if (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start) {
            material.name._M_dataplus._M_p =
                 (pointer)(*(ulong *)(attrib.normals.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar14 * 3) ^
                          0x8000000080000000);
            material.name._M_string_length =
                 CONCAT44(material.name._M_string_length._4_4_,
                          attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar14 * 3 + 2]) ^ 0x80000000;
            std::
            vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
            ::emplace_back<glm::vec<3,float,(glm::qualifier)0>>
                      ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                        *)this_00,(vec<3,_float,_(glm::qualifier)0> *)&material);
          }
          if (attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start) {
            material.name._M_dataplus._M_p = (pointer)0x0;
            std::
            vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
            ::emplace_back<glm::vec<2,float,(glm::qualifier)0>>
                      (local_7b0,(vec<2,_float,_(glm::qualifier)0> *)&material);
          }
          else {
            material.name._M_dataplus._M_p =
                 *(pointer *)
                  (attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)iVar2 * 2);
            std::
            vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
            ::emplace_back<glm::vec<2,float,(glm::qualifier)0>>
                      (local_7b0,(vec<2,_float,_(glm::qualifier)0> *)&material);
          }
          material.name._M_dataplus._M_p =
               *(pointer *)
                (attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + (long)iVar1 * 3);
          material.name._M_string_length =
               CONCAT44(0x3f800000,
                        attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)(iVar1 * 3) + 2]);
          std::
          vector<glm::vec<4,float,(glm::qualifier)0>,std::allocator<glm::vec<4,float,(glm::qualifier)0>>>
          ::emplace_back<glm::vec<4,float,(glm::qualifier)0>>
                    ((vector<glm::vec<4,float,(glm::qualifier)0>,std::allocator<glm::vec<4,float,(glm::qualifier)0>>>
                      *)&this->m_vertexColors,(vec<4,_float,_(glm::qualifier)0> *)&material);
          material.name._M_dataplus._M_p._0_4_ =
               (int)(((long)(this->m_vertexPositions).
                            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_vertexPositions).
                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0xc) + -1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((this->m_ibos).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar7,(uint *)&material);
        }
        if (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start) {
          pvVar4 = (this->m_vertexPositions).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          vVar16 = glm::operator-(pvVar4 + -2,pvVar4 + -3);
          material.name._M_dataplus._M_p = vVar16.field_0._0_8_;
          material.name._M_string_length =
               CONCAT44(material.name._M_string_length._4_4_,vVar16.field_0._8_4_);
          vVar16 = glm::operator-(pvVar4 + -1,pvVar4 + -3);
          local_698.field_0.z = (float)vVar16.field_0._8_4_;
          local_698._0_8_ = vVar16.field_0._0_8_;
          vVar16 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call
                             ((vec<3,_float,_(glm::qualifier)0> *)&material,
                              (vec<3,_float,_(glm::qualifier)0> *)&local_698.field_0);
          local_6a8.field_0.z = (float)vVar16.field_0._8_4_;
          local_6a8._0_8_ = vVar16.field_0._0_8_;
          vVar16 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call
                             ((vec<3,_float,_(glm::qualifier)0> *)&local_6a8.field_0);
          local_7c0.field_0.z = (float)vVar16.field_0._8_4_;
          local_7c0._0_8_ = vVar16.field_0._0_8_;
          std::
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ::push_back(this_00,(value_type *)&local_7c0.field_0);
          std::
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ::push_back(this_00,(value_type *)&local_7c0.field_0);
          std::
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ::push_back(this_00,(value_type *)&local_7c0.field_0);
        }
        local_7e0 = local_7e0 + 0x24;
        paVar9 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
    }
    computeTangents(this);
    cleanUpDuplicates(this);
    tinyobj::anon_struct_1392_47_816f60ef::~material_t(&local_5a0);
    std::__cxx11::string::~string((string *)&err);
    std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&materials);
    std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector(&shapes);
    tinyobj::attrib_t::~attrib_t(&attrib);
    return;
  }
  exit(1);
}

Assistant:

void ObjLoader::parseFile(const std::string & filename)
{
  tinyobj::attrib_t attrib;
  std::vector<tinyobj::shape_t> shapes;
  std::vector<tinyobj::material_t> materials;
  std::string err;
  bool ret = tinyobj::LoadObj(&attrib, &shapes, &materials, &err, filename.c_str(), m_rootDir.c_str());
  if (!err.empty()) {
    std::cerr << err << std::endl;
  }
  if (!ret) {
    exit(1);
  }

  // Loop over materials
  tinyobj::material_t defaultMaterial;
  defaultMaterial.ambient[0] = defaultMaterial.ambient[1] = defaultMaterial.ambient[2] = 0.1;
  defaultMaterial.diffuse[0] = defaultMaterial.diffuse[1] = defaultMaterial.diffuse[2] = 0.3;
  defaultMaterial.specular[0] = defaultMaterial.specular[1] = defaultMaterial.specular[2] = 0.2;
  defaultMaterial.shininess = 1;
  defaultMaterial.name = "default_material";
  materials.push_back(defaultMaterial);
  for (size_t m = 0; m < materials.size(); m++) {
    tinyobj::material_t * mp = &materials[m];
    SimpleMaterial material;
    material.name = mp->name;
    material.ambient = *reinterpret_cast<glm::vec3 *>(mp->ambient);
    material.diffuse = *reinterpret_cast<glm::vec3 *>(mp->diffuse);
    material.specular = *reinterpret_cast<glm::vec3 *>(mp->specular);
    material.shininess = mp->shininess;
    material.diffuseTexName = (mp->diffuse_texname != "") ? mp->diffuse_texname : defaultDiffuseName;
    material.normalTexName = (mp->normal_texname != "") ? mp->normal_texname : defaultNormalName;
    material.specularTexName = (mp->normal_texname != "") ? mp->specular_texname : defaultDiffuseName;
    loadImage(mp->diffuse_texname);
    loadImage(mp->normal_texname);
    loadImage(mp->specular_texname);
    m_materials.push_back(material);
  }

  m_ibos.resize(m_materials.size());
  // Loop over shapes
  for (size_t s = 0; s < shapes.size(); s++) {
    // Loop over faces(polygon)
    for (size_t f = 0; f < shapes[s].mesh.num_face_vertices.size(); f++) {
      int current_material_id = shapes[s].mesh.material_ids[f];
      if ((current_material_id < 0) || (current_material_id >= static_cast<int>(materials.size()))) {
        // Invalid material ID. Use default material.
        current_material_id = materials.size() - 1; // Default material is added to the last item in `materials`.
      }

      // Loop over vertices in the face.
      for (size_t v = 0; v < 3; v++) {
        // access to vertex
        tinyobj::index_t idx = shapes[s].mesh.indices[3 * f + v];
        tinyobj::real_t vx = attrib.vertices[3 * idx.vertex_index + 0];
        tinyobj::real_t vy = attrib.vertices[3 * idx.vertex_index + 1];
        tinyobj::real_t vz = attrib.vertices[3 * idx.vertex_index + 2];
        m_vertexPositions.push_back(glm::vec3(vx, vy, vz));

        if (attrib.normals.size() > 0) {
          tinyobj::real_t nx = attrib.normals[3 * idx.normal_index + 0];
          tinyobj::real_t ny = attrib.normals[3 * idx.normal_index + 1];
          tinyobj::real_t nz = attrib.normals[3 * idx.normal_index + 2];
          m_vertexNormals.push_back(-glm::vec3(nx, ny, nz));
        }
        if (attrib.texcoords.size() > 0) {
          tinyobj::real_t tx = attrib.texcoords[2 * idx.texcoord_index + 0];
          tinyobj::real_t ty = attrib.texcoords[2 * idx.texcoord_index + 1];
          m_vertexUVs.push_back(glm::vec2(tx, ty));
        } else {
          m_vertexUVs.push_back({0, 0});
        }
        //! note: beware attrib.colors is not empty even if no colors were specified (it is filled with black colors)
        tinyobj::real_t cR = attrib.colors[3 * idx.vertex_index + 0];
        tinyobj::real_t cG = attrib.colors[3 * idx.vertex_index + 1];
        tinyobj::real_t cB = attrib.colors[3 * idx.vertex_index + 2];
        tinyobj::real_t cA = 1;
        m_vertexColors.push_back(glm::vec4(cR, cG, cB, cA));
        m_ibos[current_material_id].push_back(m_vertexPositions.size() - 1);
      }

      // Compute the geometric normal if not specified.
      if (attrib.normals.size() == 0) {
        size_t nbVertices = m_vertexPositions.size();
        const glm::vec3 & v0 = m_vertexPositions[nbVertices - 3];
        const glm::vec3 & v1 = m_vertexPositions[nbVertices - 2];
        const glm::vec3 & v2 = m_vertexPositions[nbVertices - 1];
        glm::vec3 normal = calcNormal(v0, v1, v2);
        m_vertexNormals.push_back(normal);
        m_vertexNormals.push_back(normal);
        m_vertexNormals.push_back(normal);
      }
    }
  }
  computeTangents();
  cleanUpDuplicates();
}